

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O2

void __thiscall
VectorSUnitTest_element_access_at_Test::TestBody(VectorSUnitTest_element_access_at_Test *this)

{
  bool bVar1;
  reference pvVar2;
  const_reference pvVar3;
  char *pcVar4;
  AssertHelper local_b0;
  AssertionResult gtest_ar_5;
  undefined8 local_98;
  _Alloc_hider _Stack_90;
  undefined1 local_88 [32];
  vector_s<unsigned_int,_5UL> vc;
  vector_s<unsigned_int,_5UL> v;
  
  gtest_ar_5._0_8_ = &vc;
  vc.size_ = 0x100000000;
  vc.data_._0_8_ = &DAT_300000002;
  vc.data_[8] = '\x04';
  vc.data_[9] = '\0';
  vc.data_[10] = '\0';
  vc.data_[0xb] = '\0';
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x5;
  estl::vector_s<unsigned_int,_5UL>::vector_s(&v,(initializer_list<unsigned_int> *)&gtest_ar_5);
  gtest_ar_5._0_8_ = gtest_ar_5._0_8_ & 0xffffffff00000000;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&v,0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&vc,"0u","v.at(0)",(uint *)&gtest_ar_5,pvVar2);
  if ((char)vc.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (vc.data_._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)vc.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x150,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vc.data_);
  gtest_ar_5._0_4_ = 1;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&v,1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&vc,"1u","v.at(1)",(uint *)&gtest_ar_5,pvVar2);
  if ((char)vc.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (vc.data_._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)vc.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x151,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vc.data_);
  gtest_ar_5._0_4_ = 2;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&v,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&vc,"2u","v.at(2)",(uint *)&gtest_ar_5,pvVar2);
  if ((char)vc.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (vc.data_._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)vc.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x152,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vc.data_);
  gtest_ar_5._0_4_ = 3;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&v,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&vc,"3u","v.at(3)",(uint *)&gtest_ar_5,pvVar2);
  if ((char)vc.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (vc.data_._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)vc.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x153,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vc.data_);
  gtest_ar_5._0_4_ = 4;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at(&v,4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&vc,"4u","v.at(4)",(uint *)&gtest_ar_5,pvVar2);
  if ((char)vc.size_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (vc.data_._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)vc.data_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x154,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)vc.data_);
  vc.size_ = (size_type)(vc.data_ + 8);
  vc.data_[8] = '\0';
  vc.data_[9] = '\0';
  vc.data_[10] = '\0';
  vc.data_[0xb] = '\0';
  vc.data_[0xc] = '\0';
  vc.data_[0xd] = '\0';
  vc.data_[0xe] = '\0';
  vc.data_[0xf] = '\0';
  vc.data_[0x10] = '\0';
  vc.data_[0x11] = '\0';
  vc.data_[0x12] = '\0';
  vc.data_[0x13] = '\0';
  vc._28_4_ = 0;
  vc.data_[0] = '\0';
  vc.data_[1] = '\0';
  vc.data_[2] = '\0';
  vc.data_[3] = '\0';
  vc.data_[4] = '\0';
  vc.data_[5] = '\0';
  vc.data_[6] = '\0';
  vc.data_[7] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    estl::vector_s<unsigned_int,_5UL>::at(&v,5);
  }
  std::__cxx11::string::assign((char *)&vc);
  testing::Message::Message((Message *)&gtest_ar_5);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
             ,0x155,(char *)vc.size_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&gtest_ar_5);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
  if (gtest_ar_5._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&vc);
  gtest_ar_5.success_ = false;
  gtest_ar_5._1_7_ = 0x1000000;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )&DAT_300000002;
  local_98._0_4_ = 4;
  local_88._8_8_ = 5;
  local_88._0_8_ = (AssertHelperData *)&gtest_ar_5;
  estl::vector_s<unsigned_int,_5UL>::vector_s(&vc,(initializer_list<unsigned_int> *)local_88);
  local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at(&vc,0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_5,"0u","vc.at(0)",(uint *)local_88,pvVar3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x159,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((AssertHelperData *)local_88._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  local_88._0_4_ = 1;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at(&vc,1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_5,"1u","vc.at(1)",(uint *)local_88,pvVar3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((AssertHelperData *)local_88._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  local_88._0_4_ = 2;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at(&vc,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_5,"2u","vc.at(2)",(uint *)local_88,pvVar3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((AssertHelperData *)local_88._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  local_88._0_4_ = 3;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at(&vc,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_5,"3u","vc.at(3)",(uint *)local_88,pvVar3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((AssertHelperData *)local_88._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  local_88._0_4_ = 4;
  pvVar3 = estl::vector_s<unsigned_int,_5UL>::at(&vc,4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_5,"4u","vc.at(4)",(uint *)local_88,pvVar3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)local_88);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((AssertHelperData *)local_88._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  gtest_ar_5._0_8_ = &local_98;
  local_98._0_4_ = 0;
  local_98._4_4_ = 0;
  _Stack_90._M_p = (pointer)0x0;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    estl::vector_s<unsigned_int,_5UL>::at(&vc,5);
  }
  std::__cxx11::string::assign(&gtest_ar_5.success_);
  testing::Message::Message((Message *)local_88);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
             ,0x15e,(char *)gtest_ar_5._0_8_);
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if ((AssertHelperData *)local_88._0_8_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_88._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, element_access_at)
{
    vector_s<unsigned, 5> v{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, v.at(0));
    EXPECT_EQ(1u, v.at(1));
    EXPECT_EQ(2u, v.at(2));
    EXPECT_EQ(3u, v.at(3));
    EXPECT_EQ(4u, v.at(4));
    EXPECT_THROW(v.at(5), std::out_of_range);

    // const variant of at()
    const vector_s<unsigned, 5> vc{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, vc.at(0));
    EXPECT_EQ(1u, vc.at(1));
    EXPECT_EQ(2u, vc.at(2));
    EXPECT_EQ(3u, vc.at(3));
    EXPECT_EQ(4u, vc.at(4));
    EXPECT_THROW(vc.at(5), std::out_of_range);
}